

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDeviceReleaseExternalSemaphoreExt(ze_external_semaphore_ext_handle_t hSemaphore)

{
  ze_pfnDeviceReleaseExternalSemaphoreExt_t pfnReleaseExternalSemaphoreExt;
  ze_result_t result;
  ze_external_semaphore_ext_handle_t hSemaphore_local;
  
  pfnReleaseExternalSemaphoreExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c2b8 != (code *)0x0) {
    pfnReleaseExternalSemaphoreExt._4_4_ = (*DAT_0011c2b8)(hSemaphore);
  }
  return pfnReleaseExternalSemaphoreExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceReleaseExternalSemaphoreExt(
        ze_external_semaphore_ext_handle_t hSemaphore   ///< [in] The handle of the external semaphore.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnReleaseExternalSemaphoreExt = context.zeDdiTable.Device.pfnReleaseExternalSemaphoreExt;
        if( nullptr != pfnReleaseExternalSemaphoreExt )
        {
            result = pfnReleaseExternalSemaphoreExt( hSemaphore );
        }
        else
        {
            // generic implementation
        }

        return result;
    }